

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_repeating_group_in_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)108>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<12u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<13u,Fixpp::Type::Char>>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<421u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<423u,Fixpp::Type::Int>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<430u,Fixpp::Type::Int>,Fixpp::TagT<63u,Fixpp::Type::Char>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>,Fixpp::TypedParsingContext<void>>
          (undefined8 param_1,undefined8 *valueToken,long message,undefined8 param_4,undefined4 tag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  
  lVar1 = valueToken[1];
  lVar2 = *(long *)(*(long *)*valueToken + 8);
  lVar3 = *(long *)(*(long *)*valueToken + 0x10);
  uVar4 = valueToken[3];
  if (*(ulong *)(message + 0x14a8) <= *(ulong *)(message + 0x14a0)) {
    llvm::
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>::Unparsed,_false>
            *)(message + 0x1498),0);
  }
  puVar5 = *(undefined4 **)(message + 0x14a0);
  *puVar5 = tag;
  *(undefined8 *)(puVar5 + 2) = uVar4;
  *(long *)(puVar5 + 4) = lVar3 - (lVar1 + lVar2);
  *(long *)(message + 0x14a0) = *(long *)(message + 0x14a0) + 0x18;
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }